

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool re2::RE2::FindAndConsumeN(StringPiece *input,RE2 *re,Arg **args,int n)

{
  bool bVar1;
  size_t consumed;
  size_t local_10;
  
  bVar1 = DoMatch(re,input,UNANCHORED,&local_10,args,n);
  if (bVar1) {
    input->data_ = input->data_ + local_10;
    input->size_ = input->size_ - local_10;
  }
  return bVar1;
}

Assistant:

bool RE2::FindAndConsumeN(StringPiece* input, const RE2& re,
                          const Arg* const args[], int n) {
  size_t consumed;
  if (re.DoMatch(*input, UNANCHORED, &consumed, args, n)) {
    input->remove_prefix(consumed);
    return true;
  } else {
    return false;
  }
}